

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

mp_int * eddsa_signing_exponent_from_data
                   (eddsa_key *ek,ecsign_extra *extra,ptrlen r_encoded,ptrlen data)

{
  ssh_hash *h;
  mp_int *pmVar1;
  ptrlen bytes;
  uchar hash [114];
  
  h = ssh_hash_new(extra->hash);
  BinarySink_put_datapl(h->binarysink_,extra->hash_prefix);
  BinarySink_put_datapl(h->binarysink_,r_encoded);
  BinarySink_put_epoint(h->binarysink_,ek->publicKey,ek->curve,true);
  BinarySink_put_datapl(h->binarysink_,data);
  ssh_hash_final(h,hash);
  bytes.len = extra->hash->hlen;
  bytes.ptr = hash;
  pmVar1 = mp_from_bytes_le(bytes);
  smemclr(hash,extra->hash->hlen);
  return pmVar1;
}

Assistant:

static mp_int *eddsa_signing_exponent_from_data(
    struct eddsa_key *ek, const struct ecsign_extra *extra,
    ptrlen r_encoded, ptrlen data)
{
    /* Hash (r || public key || message) */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    put_datapl(h, extra->hash_prefix);
    put_datapl(h, r_encoded);
    put_epoint(h, ek->publicKey, ek->curve, true); /* omit string header */
    put_datapl(h, data);
    ssh_hash_final(h, hash);

    /* Convert to an integer */
    mp_int *toret = mp_from_bytes_le(make_ptrlen(hash, extra->hash->hlen));

    smemclr(hash, extra->hash->hlen);
    return toret;
}